

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

ComponentPtr __thiscall libcellml::Annotator::component(Annotator *this,string *id,size_t index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ComponentPtr CVar2;
  Annotator local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  item(&local_20,id,index);
  CVar2 = AnyCellmlElement::component((AnyCellmlElement *)this);
  _Var1 = CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_20.super_Logger.mPimpl != (LoggerImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20.super_Logger.mPimpl);
    _Var1._M_pi = extraout_RDX;
  }
  CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr Annotator::component(const std::string &id, size_t index)
{
    return item(id, index)->component();
}